

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O3

int Curl_getaddrinfo_ex(char *nodename,char *servname,addrinfo *hints,Curl_addrinfo **result)

{
  sockaddr *psVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  Curl_addrinfo *pCVar12;
  sockaddr *psVar13;
  char *pcVar14;
  addrinfo *paVar15;
  Curl_addrinfo *pCVar16;
  Curl_addrinfo *pCVar17;
  addrinfo *aihead;
  addrinfo *local_38;
  
  *result = (Curl_addrinfo *)0x0;
  iVar11 = getaddrinfo(nodename,servname,(addrinfo *)hints,&local_38);
  if (iVar11 != 0) {
    return iVar11;
  }
  if (local_38 == (addrinfo *)0x0) {
    pCVar16 = (Curl_addrinfo *)0x0;
  }
  else {
    pCVar16 = (Curl_addrinfo *)0x0;
    paVar15 = local_38;
    pCVar17 = (Curl_addrinfo *)0x0;
    do {
      pCVar12 = pCVar17;
      if (((paVar15->ai_family == 2) && (paVar15->ai_addr != (sockaddr *)0x0)) &&
         (0xf < paVar15->ai_addrlen)) {
        pCVar12 = (Curl_addrinfo *)(*Curl_cmalloc)(0x30);
        if (pCVar12 != (Curl_addrinfo *)0x0) {
          iVar11 = paVar15->ai_family;
          iVar3 = paVar15->ai_socktype;
          iVar4 = paVar15->ai_protocol;
          pCVar12->ai_flags = paVar15->ai_flags;
          pCVar12->ai_family = iVar11;
          pCVar12->ai_socktype = iVar3;
          pCVar12->ai_protocol = iVar4;
          pCVar12->ai_addrlen = 0x10;
          pCVar12->ai_canonname = (char *)0x0;
          pCVar12->ai_addr = (sockaddr *)0x0;
          pCVar12->ai_next = (Curl_addrinfo *)0x0;
          psVar13 = (sockaddr *)(*Curl_cmalloc)(0x10);
          pCVar12->ai_addr = psVar13;
          if (psVar13 != (sockaddr *)0x0) {
            psVar1 = paVar15->ai_addr;
            cVar5 = psVar1->sa_data[0];
            cVar6 = psVar1->sa_data[1];
            cVar7 = psVar1->sa_data[2];
            cVar8 = psVar1->sa_data[3];
            cVar9 = psVar1->sa_data[4];
            cVar10 = psVar1->sa_data[5];
            uVar2 = *(undefined8 *)(psVar1->sa_data + 6);
            psVar13->sa_family = psVar1->sa_family;
            psVar13->sa_data[0] = cVar5;
            psVar13->sa_data[1] = cVar6;
            psVar13->sa_data[2] = cVar7;
            psVar13->sa_data[3] = cVar8;
            psVar13->sa_data[4] = cVar9;
            psVar13->sa_data[5] = cVar10;
            *(undefined8 *)(psVar13->sa_data + 6) = uVar2;
            if (paVar15->ai_canonname != (char *)0x0) {
              pcVar14 = (*Curl_cstrdup)(paVar15->ai_canonname);
              pCVar12->ai_canonname = pcVar14;
              if (pcVar14 == (char *)0x0) {
                (*Curl_cfree)(pCVar12->ai_addr);
                goto LAB_00508991;
              }
            }
            if (pCVar16 == (Curl_addrinfo *)0x0) {
              pCVar16 = pCVar12;
            }
            if (pCVar17 != (Curl_addrinfo *)0x0) {
              pCVar17->ai_next = pCVar12;
            }
            goto LAB_005088ad;
          }
LAB_00508991:
          (*Curl_cfree)(pCVar12);
        }
        if (local_38 != (addrinfo *)0x0) {
          freeaddrinfo(local_38);
        }
        iVar11 = -10;
        while (pCVar16 != (Curl_addrinfo *)0x0) {
          (*Curl_cfree)(pCVar16->ai_addr);
          (*Curl_cfree)(pCVar16->ai_canonname);
          pCVar17 = pCVar16->ai_next;
          (*Curl_cfree)(pCVar16);
          pCVar16 = pCVar17;
        }
        pCVar16 = (Curl_addrinfo *)0x0;
        goto LAB_00508970;
      }
LAB_005088ad:
      paVar15 = paVar15->ai_next;
      pCVar17 = pCVar12;
    } while (paVar15 != (addrinfo *)0x0);
    if (local_38 != (addrinfo *)0x0) {
      freeaddrinfo(local_38);
    }
  }
  iVar11 = (uint)(pCVar16 != (Curl_addrinfo *)0x0) * 2 + -2;
LAB_00508970:
  *result = pCVar16;
  return iVar11;
}

Assistant:

int
Curl_getaddrinfo_ex(const char *nodename,
                    const char *servname,
                    const struct addrinfo *hints,
                    Curl_addrinfo **result)
{
  const struct addrinfo *ai;
  struct addrinfo *aihead;
  Curl_addrinfo *cafirst = NULL;
  Curl_addrinfo *calast = NULL;
  Curl_addrinfo *ca;
  size_t ss_size;
  int error;

  *result = NULL; /* assume failure */

  error = getaddrinfo(nodename, servname, hints, &aihead);
  if(error)
    return error;

  /* traverse the addrinfo list */

  for(ai = aihead; ai != NULL; ai = ai->ai_next) {

    /* ignore elements with unsupported address family, */
    /* settle family-specific sockaddr structure size.  */
    if(ai->ai_family == AF_INET)
      ss_size = sizeof(struct sockaddr_in);
#ifdef ENABLE_IPV6
    else if(ai->ai_family == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
#endif
    else
      continue;

    /* ignore elements without required address info */
    if((ai->ai_addr == NULL) || !(ai->ai_addrlen > 0))
      continue;

    /* ignore elements with bogus address size */
    if((size_t)ai->ai_addrlen < ss_size)
      continue;

    ca = malloc(sizeof(Curl_addrinfo));
    if(!ca) {
      error = EAI_MEMORY;
      break;
    }

    /* copy each structure member individually, member ordering, */
    /* size, or padding might be different for each platform.    */

    ca->ai_flags     = ai->ai_flags;
    ca->ai_family    = ai->ai_family;
    ca->ai_socktype  = ai->ai_socktype;
    ca->ai_protocol  = ai->ai_protocol;
    ca->ai_addrlen   = (curl_socklen_t)ss_size;
    ca->ai_addr      = NULL;
    ca->ai_canonname = NULL;
    ca->ai_next      = NULL;

    ca->ai_addr = malloc(ss_size);
    if(!ca->ai_addr) {
      error = EAI_MEMORY;
      free(ca);
      break;
    }
    memcpy(ca->ai_addr, ai->ai_addr, ss_size);

    if(ai->ai_canonname != NULL) {
      ca->ai_canonname = strdup(ai->ai_canonname);
      if(!ca->ai_canonname) {
        error = EAI_MEMORY;
        free(ca->ai_addr);
        free(ca);
        break;
      }
    }

    /* if the return list is empty, this becomes the first element */
    if(!cafirst)
      cafirst = ca;

    /* add this element last in the return list */
    if(calast)
      calast->ai_next = ca;
    calast = ca;

  }

  /* destroy the addrinfo list */
  if(aihead)
    freeaddrinfo(aihead);

  /* if we failed, also destroy the Curl_addrinfo list */
  if(error) {
    Curl_freeaddrinfo(cafirst);
    cafirst = NULL;
  }
  else if(!cafirst) {
#ifdef EAI_NONAME
    /* rfc3493 conformant */
    error = EAI_NONAME;
#else
    /* rfc3493 obsoleted */
    error = EAI_NODATA;
#endif
#ifdef USE_WINSOCK
    SET_SOCKERRNO(error);
#endif
  }

  *result = cafirst;

  /* This is not a CURLcode */
  return error;
}